

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

FUDMFKey * __thiscall FUDMFKeys::Find(FUDMFKeys *this,FName *key)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FUDMFKey *pFVar4;
  int local_28;
  int mid;
  int max;
  int min;
  FName *key_local;
  FUDMFKeys *this_local;
  
  if ((this->mSorted & 1U) == 0) {
    this->mSorted = true;
    Sort(this);
  }
  mid = 0;
  uVar2 = TArray<FUDMFKey,_FUDMFKey>::Size(&this->super_TArray<FUDMFKey,_FUDMFKey>);
  local_28 = uVar2 - 1;
  while( true ) {
    if (local_28 < mid) {
      return (FUDMFKey *)0x0;
    }
    iVar3 = (mid + local_28) / 2;
    pFVar4 = TArray<FUDMFKey,_FUDMFKey>::operator[]
                       (&this->super_TArray<FUDMFKey,_FUDMFKey>,(long)iVar3);
    bVar1 = FName::operator==(&pFVar4->Key,key);
    if (bVar1) break;
    pFVar4 = TArray<FUDMFKey,_FUDMFKey>::operator[]
                       (&this->super_TArray<FUDMFKey,_FUDMFKey>,(long)iVar3);
    bVar1 = FName::operator<=(&pFVar4->Key,key);
    if (bVar1) {
      mid = iVar3 + 1;
    }
    else {
      local_28 = iVar3 + -1;
    }
  }
  pFVar4 = TArray<FUDMFKey,_FUDMFKey>::operator[]
                     (&this->super_TArray<FUDMFKey,_FUDMFKey>,(long)iVar3);
  return pFVar4;
}

Assistant:

FUDMFKey *FUDMFKeys::Find(FName key)
{
	if (!mSorted)
	{
		mSorted = true;
		Sort();
	}
	int min = 0, max = Size()-1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		if ((*this)[mid].Key == key)
		{
			return &(*this)[mid];
		}
		else if ((*this)[mid].Key <= key)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}